

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChargeR.cpp
# Opt level: O0

void __thiscall OpenMD::ChargeR::writeChargeR(ChargeR *this)

{
  double dVar1;
  double dVar2;
  byte bVar3;
  char *pcVar4;
  ostream *poVar5;
  size_type sVar6;
  reference pvVar7;
  undefined8 uVar8;
  long in_RDI;
  __type _Var9;
  __type _Var10;
  RealType r;
  RealType volShell;
  RealType rUpper;
  RealType rLower;
  uint i;
  RealType binCharge;
  ofstream rdfStream;
  undefined8 in_stack_fffffffffffffd48;
  int iVar11;
  ostream *in_stack_fffffffffffffd50;
  uint local_224;
  ostream local_208 [520];
  
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_208,pcVar4,_S_out);
  bVar3 = std::ofstream::is_open();
  if ((bVar3 & 1) == 0) {
    uVar8 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,"ChargeR: unable to open %s\n",uVar8);
    painCave.isFatal = 1;
    simError();
  }
  else {
    poVar5 = std::operator<<(local_208,"#ChargeR ");
    std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(local_208,"#selection: (");
    poVar5 = std::operator<<(poVar5,(string *)(in_RDI + 0xd8));
    std::operator<<(poVar5,")\n");
    poVar5 = std::operator<<(local_208,"# r ");
    std::operator<<(poVar5,"\tcharge\n");
    for (local_224 = 0;
        sVar6 = std::vector<double,_std::allocator<double>_>::size
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x770)),
        local_224 < sVar6; local_224 = local_224 + 1) {
      iVar11 = (int)((ulong)in_stack_fffffffffffffd48 >> 0x20);
      _Var9 = std::pow<double,int>((double)in_stack_fffffffffffffd50,iVar11);
      _Var10 = std::pow<double,int>((double)in_stack_fffffffffffffd50,iVar11);
      dVar1 = *(double *)(in_RDI + 0x720);
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x770),
                          (ulong)local_224);
      dVar2 = *pvVar7;
      iVar11 = *(int *)(in_RDI + 0xd0);
      poVar5 = (ostream *)std::ostream::operator<<(local_208,dVar1 * ((double)local_224 + 0.5));
      poVar5 = std::operator<<(poVar5,"\t");
      in_stack_fffffffffffffd50 =
           (ostream *)
           std::ostream::operator<<
                     (poVar5,dVar2 / ((((_Var9 - _Var10) * 12.566370614359172) / 3.0) *
                                     (double)iVar11));
      std::operator<<(in_stack_fffffffffffffd50,"\n");
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_208);
  return;
}

Assistant:

void ChargeR::writeChargeR() {
    std::ofstream rdfStream(outputFilename_.c_str());
    if (rdfStream.is_open()) {
      rdfStream << "#ChargeR "
                << "\n";
      rdfStream << "#selection: (" << selectionScript_ << ")\n";
      rdfStream << "# r "
                << "\tcharge\n";
      RealType binCharge;
      for (unsigned int i = 0; i < chargeR_.size(); ++i) {
        RealType rLower = i * deltaR_;
        RealType rUpper = rLower + deltaR_;
        RealType volShell =
            (4.0 * Constants::PI) * (pow(rUpper, 3) - pow(rLower, 3)) / 3.0;

        RealType r = deltaR_ * (i + 0.5);

        binCharge = chargeR_[i] / (volShell * nProcessed_);

        rdfStream << r << "\t" << binCharge << "\n";
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "ChargeR: unable to open %s\n", outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }

    rdfStream.close();
  }